

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O2

void __thiscall
nv::SlowCompressor::compressDXT1a
          (SlowCompressor *this,Private *compressionOptions,Private *outputOptions)

{
  OutputHandler *pOVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint x;
  uint uVar7;
  uint y;
  uint uVar8;
  bool bVar9;
  anon_union_4_2_12391d8d_for_Color32_0 local_594;
  BlockDXT1 block;
  ColorBlock rgba;
  WeightedClusterFit fit;
  ColourSet colours;
  
  uVar4 = Image::width(this->m_image);
  uVar5 = Image::height(this->m_image);
  ColorBlock::ColorBlock(&rgba);
  squish::WeightedClusterFit::WeightedClusterFit(&fit);
  squish::WeightedClusterFit::SetMetric
            (&fit,(compressionOptions->colorWeight).m_x,(compressionOptions->colorWeight).m_y,
             (compressionOptions->colorWeight).m_z);
  uVar8 = 0;
  do {
    if (uVar5 <= uVar8) {
      return;
    }
    for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 4) {
      ColorBlock::init(&rgba,(EVP_PKEY_CTX *)this->m_image);
      bVar2 = true;
      bVar3 = false;
      for (lVar6 = 3; lVar6 != 0x43; lVar6 = lVar6 + 4) {
        bVar9 = -1 < *(char *)((long)&rgba.m_color[0].field_0 + lVar6);
        bVar3 = (bool)(bVar3 | bVar9);
        bVar2 = (bool)(bVar2 & bVar9);
      }
      if (bVar3) {
        if (!bVar2) goto LAB_001aeb78;
LAB_001aebc3:
        local_594 = rgba.m_color[0].field_0;
        OptimalCompress::compressDXT1a((Color32 *)&local_594.field_0,&block);
      }
      else {
        bVar3 = ColorBlock::isSingleColor(&rgba);
        if (bVar3 || bVar2) goto LAB_001aebc3;
LAB_001aeb78:
        squish::ColourSet::ColourSet(&colours,(u8 *)&rgba,0x81,false);
        squish::WeightedClusterFit::SetColourSet(&fit,&colours,1);
        squish::ColourFit::Compress(&fit.super_ColourFit,&block);
      }
      pOVar1 = outputOptions->outputHandler;
      if (pOVar1 != (OutputHandler *)0x0) {
        (*pOVar1->_vptr_OutputHandler[3])(pOVar1,&block,8);
      }
    }
    uVar8 = uVar8 + 4;
  } while( true );
}

Assistant:

void nv::SlowCompressor::compressDXT1a(const CompressionOptions::Private & compressionOptions, const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT1 block;

	squish::WeightedClusterFit fit;
	fit.SetMetric(compressionOptions.colorWeight.x(), compressionOptions.colorWeight.y(), compressionOptions.colorWeight.z());

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			
			rgba.init(m_image, x, y);
			
			bool anyAlpha = false;
			bool allAlpha = true;
			
			for (uint i = 0; i < 16; i++)
			{
				if (rgba.color(i).a < 128) anyAlpha = true;
				else allAlpha = false;
			}
			
			if ((!anyAlpha && rgba.isSingleColor() || allAlpha))
			{
				OptimalCompress::compressDXT1a(rgba.color(0), &block);
			}
			else
			{
				squish::ColourSet colours((uint8 *)rgba.colors(), squish::kDxt1|squish::kWeightColourByAlpha);
				fit.SetColourSet(&colours, squish::kDxt1);
				fit.Compress(&block);
			}
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}